

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_base64.c
# Opt level: O3

void * uo_base64_decode(void *dst,char *src,size_t src_len)

{
  byte bVar1;
  byte bVar2;
  uchar *a;
  byte *pbVar3;
  uchar *b;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  
  pbVar4 = (byte *)((long)dst + 1);
  pbVar3 = (byte *)src;
  do {
    bVar1 = pbVar3[2];
    if (pbVar3 + 4 < src + src_len) {
      bVar6 = pbVar3[3];
    }
    else if ((bVar1 == 0x3d) || (bVar6 = pbVar3[3], bVar6 == 0x3d)) {
      pbVar5 = pbVar4 + -1;
      if (pbVar3 < src + src_len) {
        bVar6 = atob[pbVar3[1]];
        bVar2 = atob[bVar1];
        pbVar4[-1] = bVar6 >> 4 | atob[*pbVar3] << 2;
        pbVar5 = pbVar4;
        if (bVar1 != 0x3d) {
          *pbVar4 = bVar2 >> 2 | bVar6 << 4;
          pbVar5 = pbVar4 + 1;
        }
      }
      return pbVar5;
    }
    bVar2 = atob[pbVar3[1]];
    bVar1 = atob[bVar1];
    pbVar4[-1] = bVar2 >> 4 | atob[*pbVar3] << 2;
    *pbVar4 = bVar1 >> 2 | bVar2 << 4;
    pbVar4[1] = bVar1 << 6 | atob[bVar6];
    pbVar4 = pbVar4 + 3;
    pbVar3 = pbVar3 + 4;
  } while( true );
}

Assistant:

void *uo_base64_decode(
    void *dst, 
    const char *src, 
    size_t src_len)
{
    unsigned char *b = (unsigned char *)dst;
    const unsigned char *a = (unsigned char *)src;
    const unsigned char *end = a + src_len;
    unsigned char a0, a1, a2, a3;

    while (a + 4 < end || a[2] != '=' && a[3] != '=')
    {
        a0 = atob[*a++];
        a1 = atob[*a++];
        a2 = atob[*a++];
        a3 = atob[*a++];

        *b++ = a0 << 2 | a1 >> 4;
        *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
        *b++ = (a2 & 0x03) << 6 | a3;
    }

    if (a < end)
    {
        a0 = atob[*a++];
        a1 = atob[*a++];
        a2 = atob[*a++];

        *b++ = a0 << 2 | a1 >> 4;

        if (a2 != (unsigned char)0x40)
            *b++ = (a1 & 0x0F) << 4 | a2 >> 2;
    }

    return b;
}